

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSMSFormat.hpp
# Opt level: O1

Mesh * __thiscall OpenMD::MSMSFormat::ReadShape(MSMSFormat *this)

{
  istream *piVar1;
  pointer pVVar2;
  Mesh *pMVar3;
  size_type sVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long *plVar8;
  ostream *poVar9;
  Vector3d vertex;
  string line;
  StringTokenizer tokenizer;
  char inbuf [180];
  string local_198;
  string local_170;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *local_150;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *local_148;
  StringTokenizer local_140;
  char local_e8 [184];
  
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  std::ios::clear((int)this->vertFile_ + (int)this->vertFile_->_vptr_basic_istream[-3]);
  std::istream::seekg(this->vertFile_,0,0);
  local_148 = &this->vertices_;
  local_150 = &this->normals_;
  while( true ) {
    piVar1 = this->vertFile_;
    std::ios::widen((char)piVar1->_vptr_basic_istream[-3] + (char)piVar1);
    plVar8 = (long *)std::istream::getline((char *)piVar1,(long)local_e8,-0x4c);
    sVar4 = local_170._M_string_length;
    if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) break;
    if (local_e8[0] != '#') {
      strlen(local_e8);
      std::__cxx11::string::_M_replace((ulong)&local_170,0,(char *)sVar4,(ulong)local_e8);
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198," ;\t\n\r","");
      StringTokenizer::StringTokenizer(&local_140,&local_170,&local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      iVar5 = StringTokenizer::countTokens(&local_140);
      if (2 < iVar5) {
        local_198._M_dataplus._M_p = (pointer)0x0;
        local_198._M_string_length = 0;
        local_198.field_2._M_allocated_capacity = 0;
        local_198._M_dataplus._M_p = (pointer)StringTokenizer::nextTokenAsDouble(&local_140);
        local_198._M_string_length = (size_type)StringTokenizer::nextTokenAsDouble(&local_140);
        local_198.field_2._M_allocated_capacity =
             (size_type)StringTokenizer::nextTokenAsDouble(&local_140);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                  (local_148,(value_type *)&local_198);
      }
      iVar5 = StringTokenizer::countTokens(&local_140);
      if (5 < iVar5) {
        local_198._M_dataplus._M_p = (pointer)0x0;
        local_198._M_string_length = 0;
        local_198.field_2._M_allocated_capacity = 0;
        local_198._M_dataplus._M_p = (pointer)StringTokenizer::nextTokenAsDouble(&local_140);
        local_198._M_string_length = (size_type)StringTokenizer::nextTokenAsDouble(&local_140);
        local_198.field_2._M_allocated_capacity =
             (size_type)StringTokenizer::nextTokenAsDouble(&local_140);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                  (local_150,(value_type *)&local_198);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140.delim_._M_dataplus._M_p != &local_140.delim_.field_2) {
        operator_delete(local_140.delim_._M_dataplus._M_p,
                        local_140.delim_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140.tokenString_._M_dataplus._M_p != &local_140.tokenString_.field_2) {
        operator_delete(local_140.tokenString_._M_dataplus._M_p,
                        local_140.tokenString_.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::ios::clear((int)this->faceFile_ + (int)this->faceFile_->_vptr_basic_istream[-3]);
  std::istream::seekg(this->faceFile_,0,0);
  while( true ) {
    piVar1 = this->faceFile_;
    std::ios::widen((char)piVar1->_vptr_basic_istream[-3] + (char)piVar1);
    plVar8 = (long *)std::istream::getline((char *)piVar1,(long)local_e8,-0x4c);
    sVar4 = local_170._M_string_length;
    if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) break;
    if (local_e8[0] != '#') {
      strlen(local_e8);
      std::__cxx11::string::_M_replace((ulong)&local_170,0,(char *)sVar4,(ulong)local_e8);
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198," ;\t\n\r","");
      StringTokenizer::StringTokenizer(&local_140,&local_170,&local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      iVar5 = StringTokenizer::countTokens(&local_140);
      if (2 < iVar5) {
        iVar5 = StringTokenizer::nextTokenAsInt(&local_140);
        iVar6 = StringTokenizer::nextTokenAsInt(&local_140);
        iVar7 = StringTokenizer::nextTokenAsInt(&local_140);
        pVVar2 = (this->vertices_).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        Mesh::add(this->mesh_,pVVar2 + (long)iVar5 + -1,pVVar2 + (long)iVar6 + -1,
                  pVVar2 + (long)iVar7 + -1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140.delim_._M_dataplus._M_p != &local_140.delim_.field_2) {
        operator_delete(local_140.delim_._M_dataplus._M_p,
                        local_140.delim_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140.tokenString_._M_dataplus._M_p != &local_140.tokenString_.field_2) {
        operator_delete(local_140.tokenString_._M_dataplus._M_p,
                        local_140.tokenString_.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"MSMS files have ",0x10);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," vertices and ",0xe);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," facets\n",8);
  pMVar3 = this->mesh_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,
                    CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                             local_170.field_2._M_local_buf[0]) + 1);
  }
  return pMVar3;
}

Assistant:

Mesh* MSMSFormat::ReadShape() {
    char inbuf[MSMSLINESIZE];
    std::string line;

    vertFile_->clear();
    vertFile_->seekg(0);

    while (vertFile_->getline(inbuf, MSMSLINESIZE)) {
      // ignore comment lines:
      if (inbuf[0] != '#') {
        line = inbuf;
        StringTokenizer tokenizer(line);
        // do we have at least 3 tokens on this vertex line?
        if (tokenizer.countTokens() >= 3) {
          Vector3d vertex;
          // int l0fa, atomid, l;
          vertex[0] = tokenizer.nextTokenAsDouble();
          vertex[1] = tokenizer.nextTokenAsDouble();
          vertex[2] = tokenizer.nextTokenAsDouble();
          vertices_.push_back(vertex);
        }
        if (tokenizer.countTokens() >= 6) {
          Vector3d normal;
          normal[0] = tokenizer.nextTokenAsDouble();
          normal[1] = tokenizer.nextTokenAsDouble();
          normal[2] = tokenizer.nextTokenAsDouble();
          normals_.push_back(normal);
        }
        // l0fa = tokenizer.nextTokenAsInt();
        // atomid = tokenizer.nextTokenAsInt();
        // l = tokenizer.nextTokenAsInt();
      }
    }

    faceFile_->clear();
    faceFile_->seekg(0);
    while (faceFile_->getline(inbuf, MSMSLINESIZE)) {
      // ignore comment lines:
      if (inbuf[0] != '#') {
        line = inbuf;
        StringTokenizer tokenizer(line);
        // do we have at least 3 tokens on this vertex line?
        if (tokenizer.countTokens() >= 3) {
          int v0, v1, v2;
          // int surftype, ana;
          v0 = tokenizer.nextTokenAsInt();
          v1 = tokenizer.nextTokenAsInt();
          v2 = tokenizer.nextTokenAsInt();
          // surftype = tokenizer.nextTokenAsInt();
          // ana = tokenizer.nextTokenAsInt();
          v0--;  // convert from 1-based indexing to 0-based indexing
          v1--;
          v2--;
          mesh_->add(vertices_[v0], vertices_[v1], vertices_[v2]);
        }
      }
    }
    std::cerr << "MSMS files have " << vertices_.size() << " vertices and ";
    std::cerr << mesh_->size() << " facets\n";
    return mesh_;
  }